

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O2

void av1_convert_model_to_params(double *params,WarpedMotionParams *model)

{
  TransformationType TVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  dVar5 = params[1];
  dVar4 = floor(*params * 64.0 + 0.5);
  dVar5 = floor(dVar5 * 64.0 + 0.5);
  uVar6 = -(uint)((int)dVar4 < 0x1000);
  uVar8 = -(uint)((int)dVar5 < 0x1000);
  uVar7 = ~uVar6 & 0x1000 | (int)dVar4 & uVar6;
  uVar9 = ~uVar8 & 0x1000 | (int)dVar5 & uVar8;
  uVar6 = -(uint)(-0x1000 < (int)uVar7);
  uVar8 = -(uint)(-0x1000 < (int)uVar9);
  *(ulong *)model->wmmat =
       CONCAT44((~uVar8 & 0xfffff000 | uVar9 & uVar8) << 10,
                (~uVar6 & 0xfffff000 | uVar7 & uVar6) << 10);
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 4) {
    uVar6 = (uint)(lVar3 == 0xc || lVar3 == 0);
    dVar5 = floor(*(double *)((long)params + lVar3 * 2 + 0x10) * 32768.0 + 0.5);
    iVar2 = (int)dVar5 + uVar6 * -0x8000;
    if (0xfff < iVar2) {
      iVar2 = 0x1000;
    }
    if (iVar2 < -0xfff) {
      iVar2 = -0x1000;
    }
    *(uint *)((long)model->wmmat + lVar3 + 8) = (iVar2 + uVar6 * 0x8000) * 2;
  }
  TVar1 = get_wmtype(model);
  model->wmtype = TVar1;
  model->invalid = '\0';
  return;
}

Assistant:

void av1_convert_model_to_params(const double *params,
                                 WarpedMotionParams *model) {
  convert_to_params(params, model->wmmat);
  model->wmtype = get_wmtype(model);
  model->invalid = 0;
}